

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.cpp
# Opt level: O0

bool __thiscall
pbrt::Curve::IntersectRay(Curve *this,Ray *r,Float tMax,optional<pbrt::ShapeIntersection> *si)

{
  Vector3<float> v;
  Vector3<float> w;
  Vector3<float> v_00;
  Vector3<float> v_01;
  initializer_list<pbrt::Point3<float>_> v_02;
  Vector3<float> v1;
  Point3<float> p2;
  Point3<float> p2_00;
  Point3<float> p2_01;
  Point3<float> p;
  Point3<float> p_00;
  Point3<float> p_01;
  Point3<float> p_02;
  Vector3f up;
  Point3f look;
  Point3f pos;
  bool bVar1;
  int iVar2;
  Point3<float> *pPVar3;
  float *pfVar4;
  long *in_RDI;
  array<pbrt::Point3<float>,_4> *paVar5;
  long in_FS_OFFSET;
  float fVar6;
  undefined1 auVar14 [56];
  undefined1 auVar8 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  Vector3<float> VVar15;
  Point3<float> PVar16;
  span<const_pbrt::Point3<float>_> cpSpan;
  int r0;
  Float eps;
  int maxDepth;
  int i;
  Float L0;
  Bounds3f rayBounds;
  Bounds3f curveBounds;
  Float maxWidth;
  array<pbrt::Point3<float>,_4> cp;
  Transform rayFromObject;
  Vector3f dy;
  int in_stack_0000054c;
  Float in_stack_00000550;
  Float in_stack_00000554;
  Transform *in_stack_00000558;
  Float in_stack_00000564;
  Ray *in_stack_00000568;
  Curve *in_stack_00000570;
  span<const_pbrt::Point3<float>_> in_stack_00000578;
  optional<pbrt::ShapeIntersection> *in_stack_000005a0;
  Vector3f dx;
  array<pbrt::Point3<float>,_4> cpObj;
  Ray ray;
  Point3<float> (*in_stack_fffffffffffff988) [4];
  float in_stack_fffffffffffff990;
  undefined4 in_stack_fffffffffffff994;
  float in_stack_fffffffffffff998;
  float in_stack_fffffffffffff99c;
  float in_stack_fffffffffffff9a0;
  float in_stack_fffffffffffff9a4;
  undefined4 in_stack_fffffffffffff9b0;
  undefined4 uVar17;
  undefined4 in_stack_fffffffffffff9b4;
  undefined4 uVar18;
  float in_stack_fffffffffffff9b8;
  float in_stack_fffffffffffff9bc;
  undefined4 in_stack_fffffffffffff9c0;
  undefined4 in_stack_fffffffffffff9c4;
  undefined1 *puVar19;
  undefined8 in_stack_fffffffffffff9d0;
  array<pbrt::Point3<float>,_4> *this_00;
  float in_stack_fffffffffffff9d8;
  float in_stack_fffffffffffff9dc;
  undefined8 in_stack_fffffffffffff9e0;
  array<pbrt::Point3<float>,_4> *this_01;
  float fVar20;
  Bounds3<float> *b;
  Bounds3<float> *in_stack_fffffffffffffa30;
  Bounds3<float> *in_stack_fffffffffffffa48;
  float in_stack_fffffffffffffa50;
  Float in_stack_fffffffffffffa54;
  span<const_pbrt::Point3<float>_> in_stack_fffffffffffffa58;
  Tuple3<pbrt::Point3,_float> in_stack_fffffffffffffa68;
  float local_524;
  float local_520;
  float local_51c;
  int local_518;
  float local_514 [9];
  undefined8 local_4f0;
  undefined4 in_stack_fffffffffffffb18;
  undefined4 in_stack_fffffffffffffb1c;
  undefined8 in_stack_fffffffffffffb30;
  float in_stack_fffffffffffffb38;
  Bounds3<float> local_4b8;
  float local_4a0;
  float fStack_49c;
  Float *in_stack_fffffffffffffb68;
  Ray *in_stack_fffffffffffffb70;
  Transform *in_stack_fffffffffffffb78;
  Bounds3<float> local_3d8;
  Float local_3b4;
  Float local_3b0;
  float local_3ac;
  undefined8 local_3a8;
  float local_3a0;
  undefined8 local_398;
  float local_390;
  undefined8 local_388;
  float local_380;
  undefined8 local_378;
  float local_370;
  undefined8 local_368;
  float local_360;
  undefined8 local_358;
  float local_350;
  undefined8 local_348;
  float local_340;
  undefined8 local_338;
  float local_330;
  undefined8 local_328;
  float local_320;
  undefined8 local_318;
  float local_310;
  undefined8 local_308;
  float local_300;
  undefined8 local_2f8;
  float local_2f0;
  undefined8 local_2e8;
  float local_2e0;
  undefined8 local_2dc;
  float local_2d4;
  undefined8 local_2d0;
  float local_2c8;
  undefined8 local_2c4;
  float local_2bc;
  undefined8 *local_2b8;
  undefined8 local_2b0;
  array<pbrt::Point3<float>,_4> local_2a8;
  undefined8 local_278;
  float local_270;
  undefined8 local_268;
  float local_260;
  undefined8 local_258;
  undefined4 in_stack_fffffffffffffdb4;
  undefined4 in_stack_fffffffffffffdd4;
  undefined4 in_stack_fffffffffffffdf4;
  undefined1 local_1e8 [128];
  undefined8 local_168;
  undefined4 local_160;
  undefined8 local_158;
  undefined4 local_150;
  undefined8 local_140;
  float local_138;
  undefined8 local_130;
  float local_128;
  undefined8 local_120;
  float local_118;
  undefined8 local_110;
  float local_108;
  undefined8 local_100;
  undefined4 local_f8;
  undefined8 local_f0;
  float local_e8;
  undefined8 local_e0;
  float local_d8;
  undefined8 local_d0;
  float local_c8;
  undefined8 local_c0;
  float local_b8;
  undefined8 local_b0;
  undefined4 local_a8;
  undefined8 local_a0;
  float local_98;
  array<pbrt::Point3<float>,_4> local_80;
  undefined8 local_50;
  undefined4 local_48;
  undefined8 local_44;
  undefined4 local_3c;
  bool local_1;
  undefined1 auVar7 [64];
  undefined1 auVar9 [64];
  
  *(long *)(in_FS_OFFSET + -0x490) = *(long *)(in_FS_OFFSET + -0x490) + 1;
  b = (Bounds3<float> *)0x0;
  Transform::operator()
            (in_stack_fffffffffffffb78,in_stack_fffffffffffffb70,in_stack_fffffffffffffb68);
  pstd::span<pbrt::Point3<float>const>::span<4ul>
            ((span<const_pbrt::Point3<float>_> *)
             CONCAT44(in_stack_fffffffffffff994,in_stack_fffffffffffff990),in_stack_fffffffffffff988
            );
  paVar5 = &local_80;
  CubicBezierControlPoints
            (in_stack_fffffffffffffa58,in_stack_fffffffffffffa54,in_stack_fffffffffffffa50);
  local_a8 = local_3c;
  local_b0 = local_44;
  pstd::array<pbrt::Point3<float>,_4>::operator[](paVar5,3);
  pPVar3 = pstd::array<pbrt::Point3<float>,_4>::operator[](paVar5,(size_t)b);
  fVar20 = (float)((ulong)paVar5 >> 0x20);
  local_d8 = (pPVar3->super_Tuple3<pbrt::Point3,_float>).z;
  local_e0._0_4_ = (pPVar3->super_Tuple3<pbrt::Point3,_float>).x;
  local_e0._4_4_ = (pPVar3->super_Tuple3<pbrt::Point3,_float>).y;
  auVar14 = ZEXT856(0);
  PVar16.super_Tuple3<pbrt::Point3,_float>.y = (float)in_stack_fffffffffffff9b4;
  PVar16.super_Tuple3<pbrt::Point3,_float>.x = (float)in_stack_fffffffffffff9b0;
  PVar16.super_Tuple3<pbrt::Point3,_float>.z = in_stack_fffffffffffff9b8;
  local_d0 = local_e0;
  local_c8 = local_d8;
  VVar15 = Point3<float>::operator-
                     ((Point3<float> *)CONCAT44(in_stack_fffffffffffff99c,in_stack_fffffffffffff998)
                      ,PVar16);
  local_108 = VVar15.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar7._0_8_ = VVar15.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar7._8_56_ = auVar14;
  local_110 = vmovlpd_avx(auVar7._0_16_);
  local_f8 = local_a8;
  local_100 = local_b0;
  auVar14 = ZEXT856(0);
  v_01.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffff9d8;
  v_01.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)in_stack_fffffffffffff9d0;
  v_01.super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)((ulong)in_stack_fffffffffffff9d0 >> 0x20)
  ;
  w.super_Tuple3<pbrt::Vector3,_float>.y = in_stack_fffffffffffff9b8;
  w.super_Tuple3<pbrt::Vector3,_float>.x = (float)in_stack_fffffffffffff9b4;
  w.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffff9bc;
  local_f0 = local_110;
  local_e8 = local_108;
  local_c0 = local_110;
  local_b8 = local_108;
  VVar15 = Cross<float>(v_01,w);
  local_138 = VVar15.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar8._0_8_ = VVar15.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar8._8_56_ = auVar14;
  local_140 = vmovlpd_avx(auVar8._0_16_);
  VVar15.super_Tuple3<pbrt::Vector3,_float>.y = in_stack_fffffffffffff9a0;
  VVar15.super_Tuple3<pbrt::Vector3,_float>.x = in_stack_fffffffffffff99c;
  VVar15.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffff9a4;
  local_130 = local_140;
  local_128 = local_138;
  local_120 = local_140;
  local_118 = local_138;
  local_a0 = local_140;
  local_98 = local_138;
  fVar6 = LengthSquared<float>(VVar15);
  if ((fVar6 == 0.0) && (!NAN(fVar6))) {
    Vector3<float>::Vector3((Vector3<float> *)0x484948);
    local_150 = local_3c;
    local_158 = local_44;
    local_160 = local_3c;
    local_168 = local_44;
    v1.super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)in_stack_fffffffffffff9e0;
    v1.super_Tuple3<pbrt::Vector3,_float>.z = (float)(int)((ulong)in_stack_fffffffffffff9e0 >> 0x20)
    ;
    v1.super_Tuple3<pbrt::Vector3,_float>.x = in_stack_fffffffffffff9dc;
    CoordinateSystem<float>
              (v1,(Vector3<float> *)CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0),
               (Vector3<float> *)CONCAT44(in_stack_fffffffffffff9bc,in_stack_fffffffffffff9b8));
  }
  fVar6 = (float)local_44;
  auVar14 = ZEXT856(0);
  v.super_Tuple3<pbrt::Vector3,_float>.y = (float)in_stack_fffffffffffff9b4;
  v.super_Tuple3<pbrt::Vector3,_float>.x = (float)in_stack_fffffffffffff9b0;
  v.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffff9b8;
  PVar16 = Point3<float>::operator+
                     ((Point3<float> *)CONCAT44(in_stack_fffffffffffff99c,in_stack_fffffffffffff998)
                      ,v);
  local_260 = PVar16.super_Tuple3<pbrt::Point3,_float>.z;
  auVar9._0_8_ = PVar16.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar9._8_56_ = auVar14;
  local_268 = vmovlpd_avx(auVar9._0_16_);
  local_258 = local_50;
  local_270 = local_98;
  local_278 = local_a0;
  puVar19 = local_1e8;
  pos.super_Tuple3<pbrt::Point3,_float>.y = (float)in_stack_fffffffffffffdf4;
  pos.super_Tuple3<pbrt::Point3,_float>.x = (float)local_3c;
  pos.super_Tuple3<pbrt::Point3,_float>.z = (float)local_268;
  look.super_Tuple3<pbrt::Point3,_float>.y = (float)in_stack_fffffffffffffdd4;
  look.super_Tuple3<pbrt::Point3,_float>.x = local_260;
  look.super_Tuple3<pbrt::Point3,_float>.z = fVar6;
  up.super_Tuple3<pbrt::Vector3,_float>.y = (float)in_stack_fffffffffffffdb4;
  up.super_Tuple3<pbrt::Vector3,_float>.x = (float)local_48;
  up.super_Tuple3<pbrt::Vector3,_float>.z = (float)local_a0;
  LookAt(pos,look,up);
  paVar5 = &local_80;
  pPVar3 = pstd::array<pbrt::Point3<float>,_4>::operator[](paVar5,0);
  local_300 = (pPVar3->super_Tuple3<pbrt::Point3,_float>).z;
  local_308._0_4_ = (pPVar3->super_Tuple3<pbrt::Point3,_float>).x;
  local_308._4_4_ = (pPVar3->super_Tuple3<pbrt::Point3,_float>).y;
  auVar14 = ZEXT856(0);
  p.super_Tuple3<pbrt::Point3,_float>.z = in_stack_fffffffffffffb38;
  p.super_Tuple3<pbrt::Point3,_float>.x = (float)(int)in_stack_fffffffffffffb30;
  p.super_Tuple3<pbrt::Point3,_float>.y = (float)(int)((ulong)in_stack_fffffffffffffb30 >> 0x20);
  local_2f8 = local_308;
  local_2f0 = local_300;
  PVar16 = Transform::operator()
                     ((Transform *)CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18),p);
  local_310 = PVar16.super_Tuple3<pbrt::Point3,_float>.z;
  auVar10._0_8_ = PVar16.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar10._8_56_ = auVar14;
  local_318 = vmovlpd_avx(auVar10._0_16_);
  this_00 = (array<pbrt::Point3<float>,_4> *)0x1;
  local_2e8 = local_318;
  local_2e0 = local_310;
  pPVar3 = pstd::array<pbrt::Point3<float>,_4>::operator[](paVar5,1);
  local_330 = (pPVar3->super_Tuple3<pbrt::Point3,_float>).z;
  local_338._0_4_ = (pPVar3->super_Tuple3<pbrt::Point3,_float>).x;
  local_338._4_4_ = (pPVar3->super_Tuple3<pbrt::Point3,_float>).y;
  auVar14 = ZEXT856(0);
  p_00.super_Tuple3<pbrt::Point3,_float>.z = in_stack_fffffffffffffb38;
  p_00.super_Tuple3<pbrt::Point3,_float>.x = (float)(int)in_stack_fffffffffffffb30;
  p_00.super_Tuple3<pbrt::Point3,_float>.y = (float)(int)((ulong)in_stack_fffffffffffffb30 >> 0x20);
  local_328 = local_338;
  local_320 = local_330;
  PVar16 = Transform::operator()
                     ((Transform *)CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18),
                      p_00);
  local_340 = PVar16.super_Tuple3<pbrt::Point3,_float>.z;
  auVar11._0_8_ = PVar16.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar11._8_56_ = auVar14;
  local_348 = vmovlpd_avx(auVar11._0_16_);
  uVar17 = 2;
  uVar18 = 0;
  local_2dc = local_348;
  local_2d4 = local_340;
  pPVar3 = pstd::array<pbrt::Point3<float>,_4>::operator[](paVar5,2);
  local_360 = (pPVar3->super_Tuple3<pbrt::Point3,_float>).z;
  local_368._0_4_ = (pPVar3->super_Tuple3<pbrt::Point3,_float>).x;
  local_368._4_4_ = (pPVar3->super_Tuple3<pbrt::Point3,_float>).y;
  auVar14 = ZEXT856(0);
  p_01.super_Tuple3<pbrt::Point3,_float>.z = in_stack_fffffffffffffb38;
  p_01.super_Tuple3<pbrt::Point3,_float>.x = (float)(int)in_stack_fffffffffffffb30;
  p_01.super_Tuple3<pbrt::Point3,_float>.y = (float)(int)((ulong)in_stack_fffffffffffffb30 >> 0x20);
  local_358 = local_368;
  local_350 = local_360;
  PVar16 = Transform::operator()
                     ((Transform *)CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18),
                      p_01);
  local_370 = PVar16.super_Tuple3<pbrt::Point3,_float>.z;
  auVar12._0_8_ = PVar16.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar12._8_56_ = auVar14;
  local_378 = vmovlpd_avx(auVar12._0_16_);
  local_2d0 = local_378;
  local_2c8 = local_370;
  pPVar3 = pstd::array<pbrt::Point3<float>,_4>::operator[](paVar5,3);
  local_390 = (pPVar3->super_Tuple3<pbrt::Point3,_float>).z;
  local_398._0_4_ = (pPVar3->super_Tuple3<pbrt::Point3,_float>).x;
  local_398._4_4_ = (pPVar3->super_Tuple3<pbrt::Point3,_float>).y;
  auVar14 = ZEXT856(0);
  p_02.super_Tuple3<pbrt::Point3,_float>.z = in_stack_fffffffffffffb38;
  p_02.super_Tuple3<pbrt::Point3,_float>.x = (float)(int)in_stack_fffffffffffffb30;
  p_02.super_Tuple3<pbrt::Point3,_float>.y = (float)(int)((ulong)in_stack_fffffffffffffb30 >> 0x20);
  local_388 = local_398;
  local_380 = local_390;
  PVar16 = Transform::operator()
                     ((Transform *)CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18),
                      p_02);
  local_3a0 = PVar16.super_Tuple3<pbrt::Point3,_float>.z;
  auVar13._0_8_ = PVar16.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar13._8_56_ = auVar14;
  local_3a8 = vmovlpd_avx(auVar13._0_16_);
  local_2b8 = &local_2e8;
  local_2b0 = 4;
  this_01 = &local_2a8;
  v_02._M_array._4_4_ = uVar18;
  v_02._M_array._0_4_ = uVar17;
  v_02._M_len = (size_type)this_01;
  local_2c4 = local_3a8;
  local_2bc = local_3a0;
  pstd::array<pbrt::Point3<float>,_4>::array(this_00,v_02);
  local_3b0 = Lerp(*(Float *)(in_RDI + 1),*(Float *)(*in_RDI + 0x34),*(Float *)(*in_RDI + 0x38));
  local_3b4 = Lerp(*(Float *)((long)in_RDI + 0xc),*(Float *)(*in_RDI + 0x34),
                   *(Float *)(*in_RDI + 0x38));
  pfVar4 = std::max<float>(&local_3b0,&local_3b4);
  local_3ac = *pfVar4;
  pstd::array<pbrt::Point3<float>,_4>::operator[](this_01,0);
  pstd::array<pbrt::Point3<float>,_4>::operator[](this_01,(size_t)this_00);
  p2.super_Tuple3<pbrt::Point3,_float>.z = in_stack_fffffffffffffa50;
  p2.super_Tuple3<pbrt::Point3,_float>._0_8_ = in_stack_fffffffffffffa48;
  Bounds3<float>::Bounds3(in_stack_fffffffffffffa30,(Point3<float>)in_stack_fffffffffffffa68,p2);
  pstd::array<pbrt::Point3<float>,_4>::operator[](this_01,CONCAT44(uVar18,uVar17));
  pstd::array<pbrt::Point3<float>,_4>::operator[](this_01,3);
  p2_00.super_Tuple3<pbrt::Point3,_float>.z = in_stack_fffffffffffffa50;
  p2_00.super_Tuple3<pbrt::Point3,_float>._0_8_ = in_stack_fffffffffffffa48;
  Bounds3<float>::Bounds3(in_stack_fffffffffffffa30,(Point3<float>)in_stack_fffffffffffffa68,p2_00);
  Union<float>((Bounds3<float> *)CONCAT44(in_stack_fffffffffffffa54,in_stack_fffffffffffffa50),
               in_stack_fffffffffffffa48);
  Expand<float,float>(b,fVar20);
  local_3d8.pMin.super_Tuple3<pbrt::Point3,_float>.x = local_4a0;
  local_3d8.pMin.super_Tuple3<pbrt::Point3,_float>.y = fStack_49c;
  Point3<float>::Point3
            ((Point3<float> *)CONCAT44(in_stack_fffffffffffff994,in_stack_fffffffffffff990),
             (float)((ulong)in_stack_fffffffffffff988 >> 0x20),SUB84(in_stack_fffffffffffff988,0),
             0.0);
  local_4f0 = local_44;
  v_00.super_Tuple3<pbrt::Vector3,_float>.z = SUB84(puVar19,0);
  v_00.super_Tuple3<pbrt::Vector3,_float>._0_8_ = paVar5;
  Length<float>(v_00);
  Point3<float>::Point3
            ((Point3<float> *)CONCAT44(in_stack_fffffffffffff994,in_stack_fffffffffffff990),
             (float)((ulong)in_stack_fffffffffffff988 >> 0x20),SUB84(in_stack_fffffffffffff988,0),
             0.0);
  p2_01.super_Tuple3<pbrt::Point3,_float>.z = in_stack_fffffffffffffa50;
  p2_01.super_Tuple3<pbrt::Point3,_float>._0_8_ = in_stack_fffffffffffffa48;
  Bounds3<float>::Bounds3(in_stack_fffffffffffffa30,(Point3<float>)in_stack_fffffffffffffa68,p2_01);
  bVar1 = Overlaps<float>(&local_4b8,&local_3d8);
  if (bVar1) {
    local_514[0] = 0.0;
    for (local_518 = 0; local_518 < 2; local_518 = local_518 + 1) {
      pPVar3 = pstd::array<pbrt::Point3<float>,_4>::operator[](&local_2a8,(long)local_518);
      in_stack_fffffffffffff998 = (pPVar3->super_Tuple3<pbrt::Point3,_float>).x;
      pPVar3 = pstd::array<pbrt::Point3<float>,_4>::operator[](&local_2a8,(long)(local_518 + 1));
      in_stack_fffffffffffff99c =
           in_stack_fffffffffffff998 - (pPVar3->super_Tuple3<pbrt::Point3,_float>).x * 2.0;
      paVar5 = &local_2a8;
      pPVar3 = pstd::array<pbrt::Point3<float>,_4>::operator[](paVar5,(long)(local_518 + 2));
      fVar6 = in_stack_fffffffffffff99c + (pPVar3->super_Tuple3<pbrt::Point3,_float>).x;
      std::abs((int)paVar5);
      local_51c = fVar6;
      pPVar3 = pstd::array<pbrt::Point3<float>,_4>::operator[](&local_2a8,(long)local_518);
      in_stack_fffffffffffff9a0 = (pPVar3->super_Tuple3<pbrt::Point3,_float>).y;
      pPVar3 = pstd::array<pbrt::Point3<float>,_4>::operator[](&local_2a8,(long)(local_518 + 1));
      in_stack_fffffffffffff9a4 =
           in_stack_fffffffffffff9a0 - (pPVar3->super_Tuple3<pbrt::Point3,_float>).y * 2.0;
      paVar5 = &local_2a8;
      pPVar3 = pstd::array<pbrt::Point3<float>,_4>::operator[](paVar5,(long)(local_518 + 2));
      fVar6 = in_stack_fffffffffffff9a4 + (pPVar3->super_Tuple3<pbrt::Point3,_float>).y;
      std::abs((int)paVar5);
      local_520 = fVar6;
      pfVar4 = std::max<float>(&local_51c,&local_520);
      uVar17 = SUB84(pfVar4,0);
      uVar18 = (undefined4)((ulong)pfVar4 >> 0x20);
      pPVar3 = pstd::array<pbrt::Point3<float>,_4>::operator[](&local_2a8,(long)local_518);
      fVar6 = (pPVar3->super_Tuple3<pbrt::Point3,_float>).z;
      pPVar3 = pstd::array<pbrt::Point3<float>,_4>::operator[](&local_2a8,(long)(local_518 + 1));
      fVar20 = (pPVar3->super_Tuple3<pbrt::Point3,_float>).z;
      paVar5 = &local_2a8;
      pPVar3 = pstd::array<pbrt::Point3<float>,_4>::operator[](paVar5,(long)(local_518 + 2));
      fVar6 = (fVar6 - fVar20 * 2.0) + (pPVar3->super_Tuple3<pbrt::Point3,_float>).z;
      std::abs((int)paVar5);
      local_524 = fVar6;
      pfVar4 = std::max<float>((float *)CONCAT44(uVar18,uVar17),&local_524);
      pfVar4 = std::max<float>(local_514,pfVar4);
      local_514[0] = *pfVar4;
    }
    if (0.0 < local_514[0]) {
      std::max<float>((float *)(*in_RDI + 0x34),(float *)(*in_RDI + 0x38));
      iVar2 = Log2Int(in_stack_fffffffffffff990);
      Clamp<int,int,int>(iVar2 / 2,0,10);
    }
    pstd::span<pbrt::Point3<float>const>::
    span<pstd::array<pbrt::Point3<float>,4>,void,pstd::array<pbrt::Point3<float>,4>>
              ((span<const_pbrt::Point3<float>_> *)
               CONCAT44(in_stack_fffffffffffff9a4,in_stack_fffffffffffff9a0),
               (array<pbrt::Point3<float>,_4> *)
               CONCAT44(in_stack_fffffffffffff99c,in_stack_fffffffffffff998));
    Inverse((Transform *)CONCAT44(in_stack_fffffffffffff9a4,in_stack_fffffffffffff9a0));
    local_1 = RecursiveIntersect(in_stack_00000570,in_stack_00000568,in_stack_00000564,
                                 in_stack_00000578,in_stack_00000558,in_stack_00000554,
                                 in_stack_00000550,in_stack_0000054c,in_stack_000005a0);
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool Curve::IntersectRay(const Ray &r, Float tMax,
                         pstd::optional<ShapeIntersection> *si) const {
#ifndef PBRT_IS_GPU_CODE
    ++nCurveTests;
#endif
    // Transform _Ray_ to curve's object space
    Ray ray = (*common->objectFromRender)(r);

    // Get object-space control points for curve segment, _cpObj_
    pstd::array<Point3f, 4> cpObj =
        CubicBezierControlPoints(pstd::span<const Point3f>(common->cpObj), uMin, uMax);

    // Project curve control points to plane perpendicular to ray
    Vector3f dx = Cross(ray.d, cpObj[3] - cpObj[0]);
    if (LengthSquared(dx) == 0) {
        Vector3f dy;
        CoordinateSystem(ray.d, &dx, &dy);
    }
    Transform rayFromObject = LookAt(ray.o, ray.o + ray.d, dx);
    pstd::array<Point3f, 4> cp = {rayFromObject(cpObj[0]), rayFromObject(cpObj[1]),
                                  rayFromObject(cpObj[2]), rayFromObject(cpObj[3])};

    // Test ray against bound of projected control points
    Float maxWidth = std::max(Lerp(uMin, common->width[0], common->width[1]),
                              Lerp(uMax, common->width[0], common->width[1]));
    Bounds3f curveBounds = Union(Bounds3f(cp[0], cp[1]), Bounds3f(cp[2], cp[3]));
    curveBounds = Expand(curveBounds, 0.5f * maxWidth);
    Bounds3f rayBounds(Point3f(0, 0, 0), Point3f(0, 0, Length(ray.d) * tMax));
    if (!Overlaps(rayBounds, curveBounds))
        return false;

    // Compute refinement depth for curve, _maxDepth_
    Float L0 = 0;
    for (int i = 0; i < 2; ++i)
        L0 = std::max(
            L0, std::max(std::max(std::abs(cp[i].x - 2 * cp[i + 1].x + cp[i + 2].x),
                                  std::abs(cp[i].y - 2 * cp[i + 1].y + cp[i + 2].y)),
                         std::abs(cp[i].z - 2 * cp[i + 1].z + cp[i + 2].z)));
    int maxDepth = 0;
    if (L0 > 0) {
        Float eps = std::max(common->width[0], common->width[1]) * .05f;  // width / 20
        // Compute log base 4 by dividing log2 in half.
        int r0 = Log2Int(1.41421356237f * 6.f * L0 / (8.f * eps)) / 2;
        maxDepth = Clamp(r0, 0, 10);
    }

    // Recursively test for ray--curve intersection
    pstd::span<const Point3f> cpSpan(cp);
    return RecursiveIntersect(ray, tMax, cpSpan, Inverse(rayFromObject), uMin, uMax,
                              maxDepth, si);
}